

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockReceiver.hpp
# Opt level: O1

void __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1>::run_for
          (MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1> *this,
          HalfCycles half_cycles)

{
  uint8_t *puVar1;
  int *piVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar7 = (long)half_cycles.super_WrappedInt<HalfCycles>.length_ +
          (this->super_MOS6526Storage).half_divider_.super_WrappedInt<HalfCycles>.length_;
  (this->super_MOS6526Storage).half_divider_.super_WrappedInt<HalfCycles>.length_ =
       (ulong)((uint)uVar7 & 1);
  if (1 < uVar7) {
    uVar7 = (long)uVar7 >> 1;
    if (0x7ffffffe < (long)uVar7) {
      uVar7 = 0x7fffffff;
    }
    uVar9 = 0xffffffff80000000;
    if (-0x80000000 < (long)uVar7) {
      uVar9 = uVar7;
    }
    do {
      uVar8 = (this->super_MOS6526Storage).pending_;
      uVar3 = uVar8 * 2;
      (this->super_MOS6526Storage).pending_ = uVar3;
      if ((uVar8 & 1) != 0) {
        puVar1 = &(this->super_MOS6526Storage).interrupt_state_;
        *puVar1 = *puVar1 | 0x80;
      }
      (this->super_MOS6526Storage).pending_ = uVar3 & 0xfffffffc;
      bVar4 = MOS6526Storage::Counter::advance<false>
                        ((this->super_MOS6526Storage).counter_,false,
                         (this->super_MOS6526Storage).cnt_state_,
                         (this->super_MOS6526Storage).cnt_edge_);
      bVar5 = MOS6526Storage::Counter::advance<true>
                        ((this->super_MOS6526Storage).counter_ + 1,
                         ((this->super_MOS6526Storage).counter_[1].control & 0x60) == 0x40 && bVar4,
                         (this->super_MOS6526Storage).cnt_state_,
                         (this->super_MOS6526Storage).cnt_edge_);
      bVar6 = bVar5 * '\x02' | bVar4;
      if ((bVar6 != 0) &&
         (bVar6 = bVar6 | (this->super_MOS6526Storage).interrupt_state_,
         (this->super_MOS6526Storage).interrupt_state_ = bVar6,
         ((this->super_MOS6526Storage).interrupt_control_ & bVar6) != 0)) {
        piVar2 = &(this->super_MOS6526Storage).pending_;
        *(byte *)piVar2 = (byte)*piVar2 | 1;
      }
      (this->super_MOS6526Storage).cnt_edge_ = false;
      uVar8 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

forceinline T &operator +=(const T &rhs) {
			length_ += rhs.length_;
			return *static_cast<T *>(this);
		}